

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O0

Nodo * __thiscall Lista<int>::iesimoNodo(Lista<int> *this,Nat i)

{
  int local_24;
  Nodo *pNStack_20;
  int posicion;
  Nodo *actual;
  Nat i_local;
  Lista<int> *this_local;
  
  pNStack_20 = this->_prim;
  for (local_24 = 0; (long)local_24 != i; local_24 = local_24 + 1) {
    pNStack_20 = pNStack_20->_sig;
  }
  return pNStack_20;
}

Assistant:

typename Lista<T>::Nodo* Lista<T>::iesimoNodo(Nat i) const {
    Nodo* actual = this->_prim;
    int posicion = 0;
    while(posicion != i) {
        actual = actual->_sig;
        posicion++;
    }

    return actual;
}